

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_lib.cpp
# Opt level: O0

void __thiscall ze_lib::context_t::context_t(context_t *this)

{
  bool bVar1;
  context_t *this_local;
  
  std::once_flag::once_flag(&this->initOnce);
  std::once_flag::once_flag(&this->initOnceDrivers);
  std::once_flag::once_flag(&this->initOnceSysMan);
  std::atomic<_ze_dditable_t_*>::atomic(&this->zeDdiTable,(__pointer_type)0x0);
  std::atomic<_zet_dditable_t_*>::atomic(&this->zetDdiTable,(__pointer_type)0x0);
  std::atomic<_zes_dditable_t_*>::atomic(&this->zesDdiTable,(__pointer_type)0x0);
  memset(&this->zelTracingDdiTable,0,0x28);
  std::atomic<_ze_dditable_t_*>::atomic(&this->pTracingZeDdiTable,(__pointer_type)0x0);
  std::atomic<unsigned_int>::atomic(&this->tracingLayerEnableCounter,0);
  this->tracing_lib = (void *)0x0;
  this->isInitialized = false;
  this->zesInuse = false;
  this->zeInuse = false;
  this->debugTraceEnabled = false;
  this->dynamicTracingSupported = true;
  this->loaderDriverGet = (ze_pfnDriverGet_t)0x0;
  bVar1 = getenv_tobool("ZE_ENABLE_LOADER_DEBUG_TRACE");
  this->debugTraceEnabled = bVar1;
  return;
}

Assistant:

__zedlllocal context_t::context_t()
    {
        debugTraceEnabled = getenv_tobool( "ZE_ENABLE_LOADER_DEBUG_TRACE" );
    }